

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3_randomness(int N,void *pBuf)

{
  bool bVar1;
  int iVar2;
  u32 uVar3;
  sqlite3_vfs *psVar4;
  long lVar5;
  uint uVar6;
  u32 uVar7;
  u32 uVar8;
  uint uVar9;
  uint uVar10;
  u32 uVar11;
  uint uVar12;
  u32 uVar13;
  uint uVar14;
  u32 uVar15;
  uint uVar16;
  uint uVar17;
  u32 uVar18;
  uint uVar19;
  uint uVar20;
  u32 uVar21;
  uint uVar22;
  uint uVar23;
  u32 uVar24;
  uint uVar25;
  uint uVar26;
  u32 uVar27;
  uint uVar28;
  long in_FS_OFFSET;
  bool bVar29;
  u32 local_9c;
  u32 local_98;
  int local_94;
  sqlite3_mutex *local_90;
  void *local_80;
  u32 local_78 [4];
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  u32 local_58;
  u32 uStack_54;
  u32 uStack_50;
  u32 uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = sqlite3_initialize();
  if (iVar2 == 0) {
    bVar1 = true;
    if ((sqlite3Config.bCoreMutex == '\0') ||
       (local_90 = (*sqlite3Config.mutex.xMutexAlloc)(5), local_90 == (sqlite3_mutex *)0x0)) {
      local_90 = (sqlite3_mutex *)0x0;
    }
    else {
      (*sqlite3Config.mutex.xMutexEnter)(local_90);
      bVar1 = false;
    }
    if (N < 1 || pBuf == (void *)0x0) {
      sqlite3Prng.s._0_8_ = sqlite3Prng.s._0_8_ & 0xffffffff00000000;
    }
    else {
      local_80 = pBuf;
      local_94 = N;
      if (sqlite3Prng.s[0] == 0) {
        uVar27 = 0;
        psVar4 = sqlite3_vfs_find((char *)0x0);
        sqlite3Prng.s[0] = 0x61707865;
        sqlite3Prng.s[1] = 0x3320646e;
        sqlite3Prng.s[2] = 0x79622d32;
        sqlite3Prng.s[3] = 0x6b206574;
        if (psVar4 == (sqlite3_vfs *)0x0) {
          sqlite3Prng.s[0xd] = 0;
          sqlite3Prng.s[0xe] = 0;
          sqlite3Prng.s[8] = 0;
          sqlite3Prng.s[9] = 0;
          sqlite3Prng.s[10] = 0;
          sqlite3Prng.s[0xb] = 0;
          sqlite3Prng.s[4] = 0;
          sqlite3Prng.s[5] = 0;
          sqlite3Prng.s[6] = 0;
          sqlite3Prng.s[7] = 0;
        }
        else if (sqlite3Config.iPrngSeed == 0) {
          (*psVar4->xRandomness)(psVar4,0x2c,(char *)(sqlite3Prng.s + 4));
          uVar27 = sqlite3Prng.s[0xc];
        }
        else {
          sqlite3Prng.s[0xd] = 0;
          sqlite3Prng.s[0xe] = 0;
          sqlite3Prng.s[9] = 0;
          sqlite3Prng.s[10] = 0;
          sqlite3Prng.s[0xb] = 0;
          sqlite3Prng.s[5] = 0;
          sqlite3Prng.s[6] = 0;
          sqlite3Prng.s[7] = 0;
          sqlite3Prng.s[8] = 0;
          sqlite3Prng.s[4] = sqlite3Config.iPrngSeed;
          uVar27 = 0;
        }
        sqlite3Prng.s[0xc] = 0;
        sqlite3Prng.n = '\0';
        sqlite3Prng.s[0xf] = uVar27;
      }
      while( true ) {
        uVar22 = (uint)sqlite3Prng.n;
        if (local_94 <= (int)uVar22) break;
        if (uVar22 != 0) {
          memcpy(local_80,sqlite3Prng.out,(ulong)sqlite3Prng.n);
          local_94 = local_94 - (uint)sqlite3Prng.n;
          local_80 = (void *)((long)local_80 + (ulong)(uint)sqlite3Prng.n);
        }
        sqlite3Prng.s[0xc] = sqlite3Prng.s[0xc] + 1;
        local_78[0] = sqlite3Prng.s[0];
        local_78[1] = sqlite3Prng.s[1];
        local_78[2] = sqlite3Prng.s[2];
        local_9c = sqlite3Prng.s[10];
        local_78[3] = sqlite3Prng.s[3];
        local_98 = sqlite3Prng.s[0xb];
        iVar2 = 10;
        uVar27 = sqlite3Prng.s[4];
        uVar3 = sqlite3Prng.s[5];
        uVar24 = sqlite3Prng.s[0xc];
        uVar8 = sqlite3Prng.s[0xd];
        uVar7 = sqlite3Prng.s[8];
        uVar15 = sqlite3Prng.s[9];
        uVar21 = sqlite3Prng.s[6];
        uVar18 = sqlite3Prng.s[0xe];
        uVar13 = sqlite3Prng.s[7];
        uVar11 = sqlite3Prng.s[0xf];
        while (bVar29 = iVar2 != 0, iVar2 = iVar2 + -1, bVar29) {
          uVar22 = uVar24 ^ local_78[0] + uVar27;
          uVar22 = uVar22 << 0x10 | uVar22 >> 0x10;
          uVar6 = uVar7 + uVar22;
          uVar25 = uVar27 ^ uVar6;
          uVar25 = uVar25 << 0xc | uVar25 >> 0x14;
          uVar9 = local_78[0] + uVar27 + uVar25;
          uVar22 = uVar22 ^ uVar9;
          uVar23 = uVar22 << 8 | uVar22 >> 0x18;
          uVar6 = uVar6 + uVar23;
          uVar25 = uVar25 ^ uVar6;
          uVar26 = uVar25 << 7 | uVar25 >> 0x19;
          uVar22 = uVar8 ^ local_78[1] + uVar3;
          uVar25 = uVar22 << 0x10 | uVar22 >> 0x10;
          uVar14 = uVar15 + uVar25;
          uVar22 = uVar3 ^ uVar14;
          uVar22 = uVar22 << 0xc | uVar22 >> 0x14;
          uVar10 = local_78[1] + uVar3 + uVar22;
          uVar25 = uVar25 ^ uVar10;
          uVar25 = uVar25 << 8 | uVar25 >> 0x18;
          uVar14 = uVar14 + uVar25;
          uVar22 = uVar22 ^ uVar14;
          uVar22 = uVar22 << 7 | uVar22 >> 0x19;
          uVar16 = uVar18 ^ local_78[2] + uVar21;
          uVar16 = uVar16 << 0x10 | uVar16 >> 0x10;
          local_9c = local_9c + uVar16;
          uVar19 = uVar21 ^ local_9c;
          uVar19 = uVar19 << 0xc | uVar19 >> 0x14;
          uVar28 = local_78[2] + uVar21 + uVar19;
          uVar16 = uVar16 ^ uVar28;
          uVar17 = uVar16 << 8 | uVar16 >> 0x18;
          local_9c = local_9c + uVar17;
          uVar19 = uVar19 ^ local_9c;
          uVar20 = uVar19 << 7 | uVar19 >> 0x19;
          uVar16 = uVar11 ^ local_78[3] + uVar13;
          uVar16 = uVar16 << 0x10 | uVar16 >> 0x10;
          local_98 = local_98 + uVar16;
          uVar19 = uVar13 ^ local_98;
          uVar12 = uVar19 << 0xc | uVar19 >> 0x14;
          uVar19 = local_78[3] + uVar13 + uVar12;
          uVar16 = uVar16 ^ uVar19;
          uVar16 = uVar16 << 8 | uVar16 >> 0x18;
          local_98 = local_98 + uVar16;
          uVar12 = uVar12 ^ local_98;
          uVar12 = uVar12 << 7 | uVar12 >> 0x19;
          uVar9 = uVar9 + uVar22;
          uVar16 = uVar16 ^ uVar9;
          uVar16 = uVar16 << 0x10 | uVar16 >> 0x10;
          local_9c = local_9c + uVar16;
          uVar22 = uVar22 ^ local_9c;
          uVar22 = uVar22 << 0xc | uVar22 >> 0x14;
          local_78[0] = uVar9 + uVar22;
          uVar16 = uVar16 ^ local_78[0];
          uVar11 = uVar16 << 8 | uVar16 >> 0x18;
          local_9c = local_9c + uVar11;
          uVar22 = uVar22 ^ local_9c;
          uVar3 = uVar22 << 7 | uVar22 >> 0x19;
          uVar10 = uVar10 + uVar20;
          uVar23 = uVar23 ^ uVar10;
          uVar9 = uVar23 << 0x10 | uVar23 >> 0x10;
          local_98 = local_98 + uVar9;
          uVar20 = uVar20 ^ local_98;
          uVar22 = uVar20 << 0xc | uVar20 >> 0x14;
          local_78[1] = uVar10 + uVar22;
          uVar9 = uVar9 ^ local_78[1];
          uVar24 = uVar9 << 8 | uVar9 >> 0x18;
          local_98 = local_98 + uVar24;
          uVar22 = uVar22 ^ local_98;
          uVar21 = uVar22 << 7 | uVar22 >> 0x19;
          uVar28 = uVar28 + uVar12;
          uVar25 = uVar25 ^ uVar28;
          uVar22 = uVar25 << 0x10 | uVar25 >> 0x10;
          uVar6 = uVar6 + uVar22;
          uVar12 = uVar12 ^ uVar6;
          uVar25 = uVar12 << 0xc | uVar12 >> 0x14;
          local_78[2] = uVar28 + uVar25;
          uVar22 = uVar22 ^ local_78[2];
          uVar8 = uVar22 << 8 | uVar22 >> 0x18;
          uVar7 = uVar6 + uVar8;
          uVar25 = uVar25 ^ uVar7;
          uVar13 = uVar25 << 7 | uVar25 >> 0x19;
          uVar19 = uVar19 + uVar26;
          uVar17 = uVar17 ^ uVar19;
          uVar22 = uVar17 << 0x10 | uVar17 >> 0x10;
          uVar14 = uVar14 + uVar22;
          uVar26 = uVar26 ^ uVar14;
          uVar6 = uVar26 << 0xc | uVar26 >> 0x14;
          local_78[3] = uVar19 + uVar6;
          uVar22 = uVar22 ^ local_78[3];
          uVar18 = uVar22 << 8 | uVar22 >> 0x18;
          uVar15 = uVar14 + uVar18;
          uVar6 = uVar6 ^ uVar15;
          uVar27 = uVar6 << 7 | uVar6 >> 0x19;
        }
        _local_68 = CONCAT44(uVar3,uVar27);
        _local_48 = CONCAT44(uVar8,uVar24);
        _local_58 = CONCAT44(uVar15,uVar7);
        _uStack_60 = CONCAT44(uVar13,uVar21);
        _uStack_40 = CONCAT44(uVar11,uVar18);
        _uStack_50 = CONCAT44(local_98,local_9c);
        for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
          *(u32 *)(sqlite3Prng.out + lVar5 * 4) = sqlite3Prng.s[lVar5] + local_78[lVar5];
        }
        sqlite3Prng.n = '@';
      }
      memcpy(local_80,sqlite3Prng.out + (int)(uVar22 - local_94),(long)local_94);
      sqlite3Prng.n = sqlite3Prng.n - (char)local_94;
    }
    if (!bVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        (*sqlite3Config.mutex.xMutexLeave)(local_90);
        return;
      }
      goto LAB_0011f3bb;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0011f3bb:
  __stack_chk_fail();
}

Assistant:

SQLITE_API void sqlite3_randomness(int N, void *pBuf){
  unsigned char *zBuf = pBuf;

  /* The "wsdPrng" macro will resolve to the pseudo-random number generator
  ** state vector.  If writable static data is unsupported on the target,
  ** we have to locate the state vector at run-time.  In the more common
  ** case where writable static data is supported, wsdPrng can refer directly
  ** to the "sqlite3Prng" state vector declared above.
  */
#ifdef SQLITE_OMIT_WSD
  struct sqlite3PrngType *p = &GLOBAL(struct sqlite3PrngType, sqlite3Prng);
# define wsdPrng p[0]
#else
# define wsdPrng sqlite3Prng
#endif

#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex;
#endif

#ifndef SQLITE_OMIT_AUTOINIT
  if( sqlite3_initialize() ) return;
#endif

#if SQLITE_THREADSAFE
  mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_PRNG);
#endif

  sqlite3_mutex_enter(mutex);
  if( N<=0 || pBuf==0 ){
    wsdPrng.s[0] = 0;
    sqlite3_mutex_leave(mutex);
    return;
  }

  /* Initialize the state of the random number generator once,
  ** the first time this routine is called.
  */
  if( wsdPrng.s[0]==0 ){
    sqlite3_vfs *pVfs = sqlite3_vfs_find(0);
    static const u32 chacha20_init[] = {
      0x61707865, 0x3320646e, 0x79622d32, 0x6b206574
    };
    memcpy(&wsdPrng.s[0], chacha20_init, 16);
    if( NEVER(pVfs==0) ){
      memset(&wsdPrng.s[4], 0, 44);
    }else{
      sqlite3OsRandomness(pVfs, 44, (char*)&wsdPrng.s[4]);
    }
    wsdPrng.s[15] = wsdPrng.s[12];
    wsdPrng.s[12] = 0;
    wsdPrng.n = 0;
  }

  assert( N>0 );
  while( 1 /* exit by break */ ){
    if( N<=wsdPrng.n ){
      memcpy(zBuf, &wsdPrng.out[wsdPrng.n-N], N);
      wsdPrng.n -= N;
      break;
    }
    if( wsdPrng.n>0 ){
      memcpy(zBuf, wsdPrng.out, wsdPrng.n);
      N -= wsdPrng.n;
      zBuf += wsdPrng.n;
    }
    wsdPrng.s[12]++;
    chacha_block((u32*)wsdPrng.out, wsdPrng.s);
    wsdPrng.n = 64;
  }
  sqlite3_mutex_leave(mutex);
}